

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.h
# Opt level: O0

int CTcSrcFile::ucs_str_starts_with(char *ustr,size_t ulen,char *astr,int big_endian,int case_fold)

{
  int iVar1;
  undefined4 in_ECX;
  char *in_RDX;
  ulong in_RSI;
  undefined4 in_R8D;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  bool ac;
  char *local_20;
  ulong local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    ac = false;
    if (1 < local_18) {
      ac = *local_20 != '\0';
    }
    if (ac == false) break;
    iVar1 = ucs_char_eq((char *)CONCAT44(in_ECX,in_R8D),ac,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffcc);
    if (iVar1 == 0) {
      return 0;
    }
    local_18 = local_18 - 2;
    local_20 = local_20 + 1;
  }
  return (uint)(*local_20 == '\0');
}

Assistant:

static int ucs_str_starts_with(const char *ustr, size_t ulen,
                                   const char *astr,
                                   int big_endian, int case_fold)
    {
        /* compare each character of the unicode string to the ascii string */
        for ( ; ulen >= 2 && *astr != '\0' ; ustr += 2, ulen -= 2, ++astr)
        {
            /* if the characters don't match, we don't have a match */
            if (!ucs_char_eq(ustr, *astr, big_endian, case_fold))
                return FALSE;
        }

        /* 
         *   if we reached the end of the ASCII string, we have a match;
         *   otherwise, we ran out of the Unicode string before we ran out of
         *   the ASCII string, so we don't have a match 
         */
        return (*astr == 0);
    }